

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int LoadEXRWithLayer(float **out_rgba,int *width,int *height,char *filename,char *layername,
                    char **err)

{
  uchar **ppuVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  size_type sVar8;
  reference pvVar9;
  void *pvVar10;
  int *in_RDX;
  int *in_RSI;
  long *in_RDI;
  char *in_R8;
  int i_4;
  uchar **src_1;
  int srcIdx_1;
  int idx_1;
  int jj_1;
  int ii_1;
  int i_3;
  int j_1;
  int it_1;
  float val;
  int i_2;
  uchar **src;
  int srcIdx;
  int idx;
  int jj;
  int ii;
  int i_1;
  int j;
  int it;
  int chIdx;
  LayerChannel *ch;
  size_t c;
  size_t ch_count;
  vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> channels;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  layer_names;
  int idxA;
  int idxB;
  int idxG;
  int idxR;
  int ret_2;
  int i;
  int ret_1;
  stringstream ss;
  int ret;
  EXRHeader exr_header;
  EXRImage exr_image;
  EXRVersion exr_version;
  EXRHeader *in_stack_fffffffffffff9f8;
  string *in_stack_fffffffffffffa00;
  string *msg;
  EXRImage *in_stack_fffffffffffffa08;
  EXRImage *exr_image_00;
  allocator *in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa18;
  undefined1 in_stack_fffffffffffffa1c;
  undefined1 in_stack_fffffffffffffa1d;
  undefined1 in_stack_fffffffffffffa1e;
  undefined1 in_stack_fffffffffffffa1f;
  size_type local_5e0;
  int local_58c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa84;
  int local_570;
  int local_56c;
  int local_568;
  undefined1 local_561 [40];
  undefined1 local_539 [40];
  allocator local_511;
  string local_510 [32];
  undefined4 local_4f0;
  int local_4ec;
  uchar **local_4e8;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  undefined4 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb2c;
  undefined4 in_stack_fffffffffffffb30;
  int iVar11;
  undefined4 in_stack_fffffffffffffb34;
  int iVar12;
  int local_4c8;
  size_type local_4b8;
  char **in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb5c;
  EXRHeader *in_stack_fffffffffffffb60;
  EXRImage *in_stack_fffffffffffffb68;
  EXRVersion *in_stack_fffffffffffffb70;
  EXRHeader *in_stack_fffffffffffffb78;
  allocator local_47b;
  byte local_47a;
  allocator local_479;
  string local_478 [32];
  vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> local_458 [2];
  int local_428;
  int local_424;
  int local_420;
  int local_41c;
  int local_418;
  int local_414;
  int local_410;
  allocator local_409;
  string local_408 [32];
  string local_3e8 [32];
  stringstream local_3c8 [16];
  ostream local_3b8 [380];
  int local_23c;
  int local_200;
  int local_1fc;
  int local_1f8;
  long local_1c8;
  int local_1c0;
  long local_1b8;
  EXRImage local_b0;
  int local_74;
  int local_70;
  allocator local_59;
  string local_58 [40];
  char *local_30;
  int *local_20;
  int *local_18;
  long *local_10;
  int local_4;
  
  if (in_RDI == (long *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"Invalid argument for LoadEXR()",&local_59);
    tinyexr::SetErrorMessage(in_stack_fffffffffffffa00,(char **)in_stack_fffffffffffff9f8);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    return -3;
  }
  local_30 = in_R8;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  InitEXRHeader((EXRHeader *)0x45c14a);
  InitEXRImage(&local_b0);
  local_23c = ParseEXRVersionFromFile
                        ((EXRVersion *)
                         CONCAT17(in_stack_fffffffffffffa1f,
                                  CONCAT16(in_stack_fffffffffffffa1e,
                                           CONCAT15(in_stack_fffffffffffffa1d,
                                                    CONCAT14(in_stack_fffffffffffffa1c,
                                                             in_stack_fffffffffffffa18)))),
                         (char *)in_stack_fffffffffffffa10);
  if (local_23c != 0) {
    std::__cxx11::stringstream::stringstream(local_3c8);
    poVar7 = std::operator<<(local_3b8,
                             "Failed to open EXR file or read version info from EXR file. code(");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_23c);
    std::operator<<(poVar7,")");
    std::__cxx11::stringstream::str();
    tinyexr::SetErrorMessage(in_stack_fffffffffffffa00,(char **)in_stack_fffffffffffff9f8);
    std::__cxx11::string::~string(local_3e8);
    local_4 = local_23c;
    std::__cxx11::stringstream::~stringstream(local_3c8);
    return local_4;
  }
  if ((local_70 != 0) || (local_74 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_408,"Loading multipart or DeepImage is not supported  in LoadEXR() API",
               &local_409);
    tinyexr::SetErrorMessage(in_stack_fffffffffffffa00,(char **)in_stack_fffffffffffff9f8);
    std::__cxx11::string::~string(local_408);
    std::allocator<char>::~allocator((allocator<char> *)&local_409);
    return -4;
  }
  local_410 = ParseEXRHeaderFromFile
                        (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
                         (char *)in_stack_fffffffffffffb68,(char **)in_stack_fffffffffffffb60);
  if (local_410 != 0) {
    FreeEXRHeader(in_stack_fffffffffffff9f8);
    return local_410;
  }
  for (local_414 = 0; local_414 < local_1c0; local_414 = local_414 + 1) {
    if (*(int *)(local_1c8 + (long)local_414 * 4) == 1) {
      *(undefined4 *)(local_1b8 + (long)local_414 * 4) = 2;
    }
  }
  local_418 = LoadEXRImageFromFile
                        (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,
                         (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                         in_stack_fffffffffffffb50);
  if (local_418 != 0) {
    FreeEXRHeader(in_stack_fffffffffffff9f8);
    return local_418;
  }
  local_41c = -1;
  local_420 = -1;
  local_424 = -1;
  local_428 = -1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x45c48e);
  tinyexr::GetLayers((EXRHeader *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                     in_stack_fffffffffffffa78);
  std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::vector
            ((vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> *)0x45c4af);
  local_47a = 0;
  if (local_30 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_478,local_30,&local_47b);
  }
  else {
    std::allocator<char>::allocator();
    local_47a = 1;
    std::__cxx11::string::string(local_478,"",&local_479);
  }
  tinyexr::ChannelsInLayer
            ((EXRHeader *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
             (string *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
             (vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> *)
             CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
  std::__cxx11::string::~string(local_478);
  if (local_30 != (char *)0x0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_47b);
  }
  if ((local_47a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_479);
  }
  sVar8 = std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::size
                    (local_458);
  if (sVar8 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffb60,"Layer Not Found",
               (allocator *)&stack0xfffffffffffffb5f);
    tinyexr::SetErrorMessage(in_stack_fffffffffffffa00,(char **)in_stack_fffffffffffff9f8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffb60);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb5f);
    FreeEXRHeader(in_stack_fffffffffffff9f8);
    FreeEXRImage(in_stack_fffffffffffffa08);
    local_4 = -0xd;
    goto LAB_0045d470;
  }
  sVar8 = std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::size
                    (local_458);
  if (sVar8 < 4) {
    local_5e0 = std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::size
                          (local_458);
  }
  else {
    local_5e0 = 4;
  }
  for (local_4b8 = 0; local_4b8 < local_5e0; local_4b8 = local_4b8 + 1) {
    pvVar9 = std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::operator[]
                       (local_458,local_4b8);
    bVar2 = std::operator==(in_stack_fffffffffffffa00,(char *)in_stack_fffffffffffff9f8);
    if (bVar2) {
      local_41c = (int)pvVar9->index;
    }
    else {
      bVar2 = std::operator==(in_stack_fffffffffffffa00,(char *)in_stack_fffffffffffff9f8);
      if (bVar2) {
        local_420 = (int)pvVar9->index;
      }
      else {
        bVar2 = std::operator==(in_stack_fffffffffffffa00,(char *)in_stack_fffffffffffff9f8);
        if (bVar2) {
          local_424 = (int)pvVar9->index;
        }
        else {
          bVar2 = std::operator==(in_stack_fffffffffffffa00,(char *)in_stack_fffffffffffff9f8);
          if (bVar2) {
            local_428 = (int)pvVar9->index;
          }
        }
      }
    }
  }
  sVar8 = std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::size
                    (local_458);
  if (sVar8 == 1) {
    pvVar9 = std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::front
                       ((vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> *)
                        in_stack_fffffffffffffa00);
    iVar6 = (int)pvVar9->index;
    pvVar10 = malloc((long)local_b0.width * 0x10 * (long)local_b0.height);
    *local_10 = (long)pvVar10;
    if (local_200 == 0) {
      for (local_4ec = 0; local_4ec < local_b0.width * local_b0.height; local_4ec = local_4ec + 1) {
        local_4f0 = *(undefined4 *)(local_b0.images[iVar6] + (long)local_4ec * 4);
        *(undefined4 *)(*local_10 + (long)(local_4ec << 2) * 4) = local_4f0;
        *(undefined4 *)(*local_10 + (long)(local_4ec * 4 + 1) * 4) = local_4f0;
        *(undefined4 *)(*local_10 + (long)(local_4ec * 4 + 2) * 4) = local_4f0;
        *(undefined4 *)(*local_10 + (long)(local_4ec * 4 + 3) * 4) = local_4f0;
      }
    }
    else {
      for (local_4c8 = 0; local_4c8 < local_b0.num_tiles; local_4c8 = local_4c8 + 1) {
        for (iVar12 = 0; iVar12 < local_1f8; iVar12 = iVar12 + 1) {
          for (iVar11 = 0; iVar11 < local_1fc; iVar11 = iVar11 + 1) {
            iVar3 = local_b0.tiles[local_4c8].offset_x * local_1fc + iVar11;
            iVar4 = local_b0.tiles[local_4c8].offset_y * local_1f8 + iVar12;
            iVar5 = iVar3 + iVar4 * local_b0.width;
            if ((iVar3 < local_b0.width) && (iVar4 < local_b0.height)) {
              iVar3 = iVar11 + iVar12 * local_1fc;
              local_4e8 = local_b0.tiles[local_4c8].images;
              *(undefined4 *)(*local_10 + (long)(iVar5 * 4) * 4) =
                   *(undefined4 *)(local_4e8[iVar6] + (long)iVar3 * 4);
              *(undefined4 *)(*local_10 + (long)(iVar5 * 4 + 1) * 4) =
                   *(undefined4 *)(local_4e8[iVar6] + (long)iVar3 * 4);
              *(undefined4 *)(*local_10 + (long)(iVar5 * 4 + 2) * 4) =
                   *(undefined4 *)(local_4e8[iVar6] + (long)iVar3 * 4);
              *(undefined4 *)(*local_10 + (long)(iVar5 * 4 + 3) * 4) =
                   *(undefined4 *)(local_4e8[iVar6] + (long)iVar3 * 4);
            }
          }
        }
      }
    }
  }
  else {
    if (local_41c == -1) {
      in_stack_fffffffffffffa10 = &local_511;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_510,"R channel not found",in_stack_fffffffffffffa10);
      tinyexr::SetErrorMessage(in_stack_fffffffffffffa00,(char **)in_stack_fffffffffffff9f8);
      std::__cxx11::string::~string(local_510);
      std::allocator<char>::~allocator((allocator<char> *)&local_511);
      FreeEXRHeader(in_stack_fffffffffffff9f8);
      FreeEXRImage(in_stack_fffffffffffffa08);
      local_4 = -4;
      goto LAB_0045d470;
    }
    if (local_420 == -1) {
      exr_image_00 = (EXRImage *)local_539;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_539 + 1),"G channel not found",(allocator *)exr_image_00);
      tinyexr::SetErrorMessage(in_stack_fffffffffffffa00,(char **)in_stack_fffffffffffff9f8);
      std::__cxx11::string::~string((string *)(local_539 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_539);
      FreeEXRHeader(in_stack_fffffffffffff9f8);
      FreeEXRImage(exr_image_00);
      local_4 = -4;
      goto LAB_0045d470;
    }
    if (local_424 == -1) {
      msg = (string *)local_561;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_561 + 1),"B channel not found",(allocator *)msg)
      ;
      tinyexr::SetErrorMessage(msg,(char **)in_stack_fffffffffffff9f8);
      std::__cxx11::string::~string((string *)(local_561 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_561);
      FreeEXRHeader(in_stack_fffffffffffff9f8);
      FreeEXRImage(in_stack_fffffffffffffa08);
      local_4 = -4;
      goto LAB_0045d470;
    }
    pvVar10 = malloc((long)local_b0.width * 0x10 * (long)local_b0.height);
    *local_10 = (long)pvVar10;
    if (local_200 == 0) {
      for (local_58c = 0; local_58c < local_b0.width * local_b0.height; local_58c = local_58c + 1) {
        *(undefined4 *)(*local_10 + (long)(local_58c << 2) * 4) =
             *(undefined4 *)(local_b0.images[local_41c] + (long)local_58c * 4);
        *(undefined4 *)(*local_10 + (long)(local_58c * 4 + 1) * 4) =
             *(undefined4 *)(local_b0.images[local_420] + (long)local_58c * 4);
        *(undefined4 *)(*local_10 + (long)(local_58c * 4 + 2) * 4) =
             *(undefined4 *)(local_b0.images[local_424] + (long)local_58c * 4);
        if (local_428 == -1) {
          *(undefined4 *)(*local_10 + (long)(local_58c * 4 + 3) * 4) = 0x3f800000;
        }
        else {
          *(undefined4 *)(*local_10 + (long)(local_58c * 4 + 3) * 4) =
               *(undefined4 *)(local_b0.images[local_428] + (long)local_58c * 4);
        }
      }
    }
    else {
      for (local_568 = 0; local_568 < local_b0.num_tiles; local_568 = local_568 + 1) {
        for (local_56c = 0; local_56c < local_1f8; local_56c = local_56c + 1) {
          for (local_570 = 0; local_570 < local_1fc; local_570 = local_570 + 1) {
            iVar6 = local_b0.tiles[local_568].offset_x * local_1fc + local_570;
            iVar12 = local_b0.tiles[local_568].offset_y * local_1f8 + local_56c;
            iVar11 = iVar6 + iVar12 * local_b0.width;
            if ((iVar6 < local_b0.width) && (iVar12 < local_b0.height)) {
              iVar6 = local_570 + local_56c * local_1fc;
              ppuVar1 = local_b0.tiles[local_568].images;
              *(undefined4 *)(*local_10 + (long)(iVar11 * 4) * 4) =
                   *(undefined4 *)(ppuVar1[local_41c] + (long)iVar6 * 4);
              *(undefined4 *)(*local_10 + (long)(iVar11 * 4 + 1) * 4) =
                   *(undefined4 *)(ppuVar1[local_420] + (long)iVar6 * 4);
              *(undefined4 *)(*local_10 + (long)(iVar11 * 4 + 2) * 4) =
                   *(undefined4 *)(ppuVar1[local_424] + (long)iVar6 * 4);
              if (local_428 == -1) {
                *(undefined4 *)(*local_10 + (long)(iVar11 * 4 + 3) * 4) = 0x3f800000;
              }
              else {
                *(undefined4 *)(*local_10 + (long)(iVar11 * 4 + 3) * 4) =
                     *(undefined4 *)(ppuVar1[local_428] + (long)iVar6 * 4);
              }
            }
          }
        }
      }
    }
  }
  *local_18 = local_b0.width;
  *local_20 = local_b0.height;
  FreeEXRHeader(in_stack_fffffffffffff9f8);
  FreeEXRImage(in_stack_fffffffffffffa08);
  local_4 = 0;
LAB_0045d470:
  std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::~vector
            ((vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> *)
             in_stack_fffffffffffffa10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffa10);
  return local_4;
}

Assistant:

int LoadEXRWithLayer(float **out_rgba, int *width, int *height,
                     const char *filename, const char *layername,
                     const char **err) {
  if (out_rgba == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for LoadEXR()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;
  InitEXRHeader(&exr_header);
  InitEXRImage(&exr_image);

  {
    int ret = ParseEXRVersionFromFile(&exr_version, filename);
    if (ret != TINYEXR_SUCCESS) {
      std::stringstream ss;
      ss << "Failed to open EXR file or read version info from EXR file. code("
         << ret << ")";
      tinyexr::SetErrorMessage(ss.str(), err);
      return ret;
    }

    if (exr_version.multipart || exr_version.non_image) {
      tinyexr::SetErrorMessage(
          "Loading multipart or DeepImage is not supported  in LoadEXR() API",
          err);
      return TINYEXR_ERROR_INVALID_DATA;  // @fixme.
    }
  }

  {
    int ret = ParseEXRHeaderFromFile(&exr_header, &exr_version, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      FreeEXRHeader(&exr_header);
      return ret;
    }
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exr_header.num_channels; i++) {
    if (exr_header.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  // TODO: Probably limit loading to layers (channels) selected by layer index
  {
    int ret = LoadEXRImageFromFile(&exr_image, &exr_header, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      FreeEXRHeader(&exr_header);
      return ret;
    }
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;

  std::vector<std::string> layer_names;
  tinyexr::GetLayers(exr_header, layer_names);

  std::vector<tinyexr::LayerChannel> channels;
  tinyexr::ChannelsInLayer(
      exr_header, layername == NULL ? "" : std::string(layername), channels);

  if (channels.size() < 1) {
    tinyexr::SetErrorMessage("Layer Not Found", err);
    FreeEXRHeader(&exr_header);
    FreeEXRImage(&exr_image);
    return TINYEXR_ERROR_LAYER_NOT_FOUND;
  }

  size_t ch_count = channels.size() < 4 ? channels.size() : 4;
  for (size_t c = 0; c < ch_count; c++) {
    const tinyexr::LayerChannel &ch = channels[c];

    if (ch.name == "R") {
      idxR = int(ch.index);
    } else if (ch.name == "G") {
      idxG = int(ch.index);
    } else if (ch.name == "B") {
      idxB = int(ch.index);
    } else if (ch.name == "A") {
      idxA = int(ch.index);
    }
  }

  if (channels.size() == 1) {
    int chIdx = int(channels.front().index);
    // Grayscale channel only.

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));

    if (exr_header.tiled) {
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (int j = 0; j < exr_header.tile_size_y; j++) {
          for (int i = 0; i < exr_header.tile_size_x; i++) {
            const int ii = exr_image.tiles[it].offset_x *
                               static_cast<int>(exr_header.tile_size_x) +
                           i;
            const int jj = exr_image.tiles[it].offset_y *
                               static_cast<int>(exr_header.tile_size_y) +
                           j;
            const int idx = ii + jj * static_cast<int>(exr_image.width);

            // out of region check.
            if (ii >= exr_image.width) {
              continue;
            }
            if (jj >= exr_image.height) {
              continue;
            }
            const int srcIdx = i + j * exr_header.tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 3] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
          }
        }
      }
    } else {
      for (int i = 0; i < exr_image.width * exr_image.height; i++) {
        const float val =
            reinterpret_cast<float **>(exr_image.images)[chIdx][i];
        (*out_rgba)[4 * i + 0] = val;
        (*out_rgba)[4 * i + 1] = val;
        (*out_rgba)[4 * i + 2] = val;
        (*out_rgba)[4 * i + 3] = val;
      }
    }
  } else {
    // Assume RGB(A)

    if (idxR == -1) {
      tinyexr::SetErrorMessage("R channel not found", err);

      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxG == -1) {
      tinyexr::SetErrorMessage("G channel not found", err);
      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxB == -1) {
      tinyexr::SetErrorMessage("B channel not found", err);
      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));
    if (exr_header.tiled) {
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (int j = 0; j < exr_header.tile_size_y; j++) {
          for (int i = 0; i < exr_header.tile_size_x; i++) {
            const int ii =
                exr_image.tiles[it].offset_x * exr_header.tile_size_x + i;
            const int jj =
                exr_image.tiles[it].offset_y * exr_header.tile_size_y + j;
            const int idx = ii + jj * exr_image.width;

            // out of region check.
            if (ii >= exr_image.width) {
              continue;
            }
            if (jj >= exr_image.height) {
              continue;
            }
            const int srcIdx = i + j * exr_header.tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[idxR][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[idxG][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[idxB][srcIdx];
            if (idxA != -1) {
              (*out_rgba)[4 * idx + 3] =
                  reinterpret_cast<float **>(src)[idxA][srcIdx];
            } else {
              (*out_rgba)[4 * idx + 3] = 1.0;
            }
          }
        }
      }
    } else {
      for (int i = 0; i < exr_image.width * exr_image.height; i++) {
        (*out_rgba)[4 * i + 0] =
            reinterpret_cast<float **>(exr_image.images)[idxR][i];
        (*out_rgba)[4 * i + 1] =
            reinterpret_cast<float **>(exr_image.images)[idxG][i];
        (*out_rgba)[4 * i + 2] =
            reinterpret_cast<float **>(exr_image.images)[idxB][i];
        if (idxA != -1) {
          (*out_rgba)[4 * i + 3] =
              reinterpret_cast<float **>(exr_image.images)[idxA][i];
        } else {
          (*out_rgba)[4 * i + 3] = 1.0;
        }
      }
    }
  }

  (*width) = exr_image.width;
  (*height) = exr_image.height;

  FreeEXRHeader(&exr_header);
  FreeEXRImage(&exr_image);

  return TINYEXR_SUCCESS;
}